

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mraa.c
# Opt level: O1

int mraa_pwm_lookup(char *pwm_name)

{
  int iVar1;
  char *__s;
  mraa_board_t *pmVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  
  pmVar2 = plat;
  if (((pwm_name != (char *)0x0 && plat != (mraa_board_t *)0x0) && (*pwm_name != '\0')) &&
     (iVar1 = plat->pwm_dev_count, 0 < (long)iVar1)) {
    lVar5 = 0;
    do {
      __s = *(char **)((long)&pmVar2->pwm_dev[0].name + lVar5);
      if (__s != (char *)0x0) {
        sVar4 = strlen(__s);
        iVar3 = strncmp(pwm_name,__s,sVar4 + 1);
        if (iVar3 == 0) {
          return *(int *)((long)&pmVar2->pwm_dev[0].index + lVar5);
        }
      }
      lVar5 = lVar5 + 0x18;
    } while ((long)iVar1 * 0x18 != lVar5);
  }
  return -1;
}

Assistant:

int
mraa_pwm_lookup(const char* pwm_name)
{
    int i;

    if (plat == NULL) {
        return -1;
    }

    if (pwm_name == NULL || strlen(pwm_name) == 0) {
        return -1;
    }

    for (i = 0; i < plat->pwm_dev_count; i++) {
        if (plat->pwm_dev[i].name != NULL &&
            strncmp(pwm_name, plat->pwm_dev[i].name, strlen(plat->pwm_dev[i].name) + 1) == 0) {
            return plat->pwm_dev[i].index;
        }
    }
    return -1;
}